

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Keno::selectNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Keno *this)

{
  ostream *poVar1;
  long *plVar2;
  pointer piVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int local_1f8;
  int currNumber;
  string line;
  _Vector_base<int,_std::allocator<int>_> local_1d0;
  _Vector_base<int,_std::allocator<int>_> local_1b8;
  istringstream istr;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Input Numbers: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::istream::ignore();
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&istr,(string *)&line,_S_in);
  currNumber = 0;
  while( true ) {
    plVar2 = (long *)std::istream::operator>>((istream *)&istr,&currNumber);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&currNumber);
  }
  for (uVar6 = (ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 2; (int)uVar6 < 10;
      uVar6 = (ulong)((int)uVar6 + 1)) {
    local_1f8 = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_1f8);
  }
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  if (0x28 < uVar6) {
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"The max selected numbers are 10!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    selectNumbers((vector<int,_std::allocator<int>_> *)&local_1b8,this);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1b8);
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3;
  }
  uVar5 = (long)uVar6 >> 2;
  for (uVar4 = 0; (long)uVar6 >> 2 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = uVar5 - (piVar3[uVar4] == 0);
  }
  if (uVar5 < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"The min selected numbers are 2!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    selectNumbers((vector<int,_std::allocator<int>_> *)&local_1d0,this);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d0);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Keno::selectNumbers() {
	//std::cin.ignore();
	std::cout << "-----------------------------------------------" << std::endl;
	std::cout << "Input Numbers: " << std::endl;
	std::cout << "-----------------------------------------------" << std::endl;
	std::vector<int>selectNumbersBet;
	//selectNumbersBet.resize(10);

	std::string line;
	std::cin.ignore();
	getline(std::cin, line);
	
	std::istringstream istr(line);
	int currNumber = 0;
	while (istr >> currNumber) {
		selectNumbersBet.push_back(currNumber);
	}
	int count = selectNumbersBet.size();
	while (count < 10) {
		selectNumbersBet.push_back(0);
		count++;
	}
	if (selectNumbersBet.size() > 10) {
		std::cout << "---------------------------------"<< std::endl;
		std::cout << "The max selected numbers are 10!" << std::endl;
		std::cout << "---------------------------------" <<std::endl;
		selectNumbers();
	}
	size_t size = selectNumbersBet.size();
	for (int i = 0; i < selectNumbersBet.size(); i++) {
		if (selectNumbersBet[i] == 0) {
			size--;
		}
	}

	if (size < 2) {
		std::cout << "---------------------------------" << std::endl;
		std::cout << "The min selected numbers are 2!"   << std::endl;
		std::cout << "---------------------------------" << std::endl;
		selectNumbers();
	}

	/*for (int i = 0; i < selectNumbersBet.size(); ++i) {
		for (int j = 1; j < selectNumbersBet.size(); ++j) {
			if (selectNumbersBet[i] == selectNumbersBet[j]) {
				std::cout << "---------------------------------" << std::endl;
				std::cout << "The Numbers must NOT repeat!" << std::endl;
				std::cout << "---------------------------------" << std::endl;
				selectNumbers();
			}
		}
	}*/
	return selectNumbersBet;
}